

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O2

int __thiscall
soul::RenderingVenue::Pimpl::SessionImpl::link(SessionImpl *this,char *__from,char *__to)

{
  _Manager_type p_Var1;
  undefined8 extraout_RAX;
  TaskFunction TStack_128;
  anon_class_240_3_a0b0fe3a local_108;
  
  local_108.this = this;
  BuildSettings::BuildSettings(&local_108.settings,(BuildSettings *)__from);
  local_108.callback.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_108.callback.super__Function_base._M_functor._8_8_ = 0;
  local_108.callback.super__Function_base._M_manager = (_Manager_type)0x0;
  local_108.callback._M_invoker = *(_Invoker_type *)(__to + 0x18);
  p_Var1 = *(_Manager_type *)(__to + 0x10);
  if (p_Var1 != (_Manager_type)0x0) {
    local_108.callback.super__Function_base._M_functor._M_unused._0_8_ =
         (undefined8)*(undefined8 *)__to;
    local_108.callback.super__Function_base._M_functor._8_8_ = *(undefined8 *)(__to + 8);
    __to[0x10] = '\0';
    __to[0x11] = '\0';
    __to[0x12] = '\0';
    __to[0x13] = '\0';
    __to[0x14] = '\0';
    __to[0x15] = '\0';
    __to[0x16] = '\0';
    __to[0x17] = '\0';
    __to[0x18] = '\0';
    __to[0x19] = '\0';
    __to[0x1a] = '\0';
    __to[0x1b] = '\0';
    __to[0x1c] = '\0';
    __to[0x1d] = '\0';
    __to[0x1e] = '\0';
    __to[0x1f] = '\0';
    local_108.callback.super__Function_base._M_manager = p_Var1;
  }
  std::function<void(std::atomic<int>&)>::
  function<soul::RenderingVenue::Pimpl::SessionImpl::link(soul::BuildSettings_const&,std::function<void(soul::CompileMessageList_const&)>)::_lambda(std::atomic<int>&)_1_,void>
            ((function<void(std::atomic<int>&)> *)&TStack_128,&local_108);
  TaskThread::Queue::addTask(&this->taskQueue,&TStack_128);
  std::_Function_base::~_Function_base(&TStack_128.super__Function_base);
  link(soul::BuildSettings_const&,std::function<void(soul::CompileMessageList_const&)>)::
  {lambda(std::atomic<int>&)#1}::~atomic((_lambda_std__atomic<int>___1_ *)&local_108);
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
}

Assistant:

bool link (const BuildSettings& settings, CompileTaskFinishedCallback linkFinishedCallback) override
        {
            taskQueue.addTask ([this, settings, callback = std::move (linkFinishedCallback)] (TaskThread::ShouldStopFlag& cancelled)
            {
                if (state == SessionState::loaded)
                {
                    CompileMessageList messageList;
                    bool ok = performer->link (messageList, settings, {});

                    if (cancelled)
                        return;

                    maxBlockSize = performer->getBlockSize();
                    SOUL_ASSERT (maxBlockSize != 0);
                    callback (messageList);

                    if (ok)
                        setState (SessionState::linked);
                }
            });

            return true;
        }